

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O0

uint64_t bitmanip::detail::ileaveZeros_shift<14u>(uint32_t input)

{
  int local_4c;
  uint shift;
  int i;
  uint64_t n;
  undefined8 uStack_38;
  int start;
  uint64_t MASKS [5];
  uint32_t input_local;
  
  MASKS[4]._4_4_ = input;
  memset(&stack0xffffffffffffffc8,0,0x28);
  uStack_38 = 0x1000200040008001;
  MASKS[0] = 0x30000000c0000003;
  MASKS[1] = 0xf00000000000000f;
  _shift = (ulong)MASKS[4]._4_4_;
  for (local_4c = 2; local_4c != -1; local_4c = local_4c + -1) {
    _shift = MASKS[(long)local_4c + -1] &
             (_shift << ((char)(1 << ((byte)local_4c & 0x1f)) * '\x0e' & 0x3fU) | _shift);
  }
  return _shift;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t ileaveZeros_shift(std::uint32_t input) noexcept
{
    if constexpr (BITS == 0) {
        return input;
    }
    else {
        constexpr std::uint64_t MASKS[] = {
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 1),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 2),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 4),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 8),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 16),
        };
        // log2_floor(0) == 0 so this is always safe, even for 1 bit
        constexpr int start = 4 - static_cast<int>(bitmanip::log2floor(BITS >> 1));

        std::uint64_t n = input;
        for (int i = start; i != -1; --i) {
            unsigned shift = BITS * (1u << i);
            n |= n << shift;
            n &= MASKS[i];
        }

        return n;
    }
}